

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O0

void __thiscall sf::Window::create(Window *this,WindowHandle handle,ContextSettings *settings)

{
  GlContext *pGVar1;
  Window *in_RDX;
  long *in_RDI;
  uint in_stack_00000014;
  WindowImpl *in_stack_00000018;
  ContextSettings *in_stack_00000020;
  WindowHandle in_stack_ffffffffffffffa8;
  WindowBase *in_stack_ffffffffffffffb0;
  
  (**(code **)(*in_RDI + 0x20))();
  WindowBase::create(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  VideoMode::getDesktopMode();
  pGVar1 = priv::GlContext::create(in_stack_00000020,in_stack_00000018,in_stack_00000014);
  in_RDI[3] = (long)pGVar1;
  initialize(in_RDX);
  return;
}

Assistant:

void Window::create(WindowHandle handle, const ContextSettings& settings)
{
    // Destroy the previous window implementation
    close();

    // Recreate the window implementation
    WindowBase::create(handle);

    // Recreate the context
    m_context = priv::GlContext::create(settings, m_impl, VideoMode::getDesktopMode().bitsPerPixel);

    // Perform common initializations
    initialize();
}